

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O1

void __thiscall LexerTest_LexHexInt_Test::TestBody(LexerTest_LexHexInt_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  string_view buffer;
  string_view buffer_00;
  string_view buffer_01;
  string_view buffer_02;
  string_view buffer_03;
  string_view buffer_04;
  string_view buffer_05;
  string_view buffer_06;
  string_view buffer_07;
  string_view buffer_08;
  string_view buffer_09;
  string_view buffer_10;
  string_view buffer_11;
  string_view buffer_12;
  string_view buffer_13;
  string_view buffer_14;
  string_view buffer_15;
  string_view buffer_16;
  string_view buffer_17;
  string_view buffer_18;
  undefined1 local_e0 [8];
  Lexer lexer;
  undefined8 local_70;
  undefined4 local_68;
  __index_type local_48;
  internal local_40 [8];
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  
  buffer._M_str = "0x0";
  buffer._M_len = 3;
  wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer);
  bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
  local_40[0] = (internal)!bVar1;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,local_40,
               (AssertionResult *)"lexer.empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x10e,(char *)lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                              _M_payload.
                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                              super__Optional_payload_base<wasm::WATParser::Token>._64_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if ((undefined8 *)
        lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
        super__Optional_payload_base<wasm::WATParser::Token>._64_8_ != &stack0xffffffffffffff90) {
      operator_delete((void *)lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                              _M_payload.
                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                              super__Optional_payload_base<wasm::WATParser::Token>._64_8_,
                      (ulong)(local_70 + 1));
    }
    if (local_28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_28._M_head_impl + 8))();
    }
    if (gtest_ar_._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar_._0_8_);
    }
  }
  else {
    lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
    super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
    lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
    super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
    local_70 = (undefined1 *)0x0;
    local_68 = 0;
    local_48 = '\x03';
    testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
              (local_40,"*lexer","expected",(Token *)&lexer.index,
               (Token *)&lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                         _M_payload.
                         super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                         super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_28);
      if (gtest_ar_._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar_._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                 ,0x110,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      if (local_28._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
    }
    if (gtest_ar_._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar_._0_8_);
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         *)&stack0xffffffffffffff90);
  }
  if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
      super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ._M_index == '\x01') {
    lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
    super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ._M_index = '\0';
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         *)((long)&lexer.curr.
                                   super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                   _M_payload.
                                   super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                   .super__Optional_payload_base<wasm::WATParser::Token>._M_payload
                           + 8));
  }
  if (!bVar1) {
    buffer_00._M_str = "+0x0";
    buffer_00._M_len = 4;
    wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_00);
    bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
    local_40[0] = (internal)!bVar1;
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_28);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)
                 &lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                  super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,local_40,
                 (AssertionResult *)"lexer.empty()","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                 ,0x114,(char *)lexer.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._64_8_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      if ((undefined8 *)
          lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
          super__Optional_payload_base<wasm::WATParser::Token>._64_8_ != &stack0xffffffffffffff90) {
        operator_delete((void *)lexer.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._64_8_,
                        (ulong)(local_70 + 1));
      }
      if (local_28._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
      if (gtest_ar_._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar_._0_8_);
      }
    }
    else {
      lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
      super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
      lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
      super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
      local_70 = (undefined1 *)0x0;
      local_68 = 1;
      local_48 = '\x03';
      testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                (local_40,"*lexer","expected",(Token *)&lexer.index,
                 (Token *)&lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                           _M_payload.
                           super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                           super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_28);
        if (gtest_ar_._0_8_ == 0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar_._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                   ,0x116,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
        if (local_28._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_28._M_head_impl + 8))();
        }
      }
      if (gtest_ar_._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar_._0_8_);
      }
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           *)&stack0xffffffffffffff90);
    }
    if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
        super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ._M_index == '\x01') {
      lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
      super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ._M_index = '\0';
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           *)((long)&lexer.curr.
                                     super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                     _M_payload.
                                     super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                     .super__Optional_payload_base<wasm::WATParser::Token>.
                                     _M_payload + 8));
    }
    if (!bVar1) {
      buffer_01._M_str = "-0x0";
      buffer_01._M_len = 4;
      wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_01);
      bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
      local_40[0] = (internal)!bVar1;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (bVar1) {
        testing::Message::Message((Message *)&local_28);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)
                   &lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload
                    .super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                    super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,local_40,
                   (AssertionResult *)"lexer.empty()","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                   ,0x11a,(char *)lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._64_8_);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
        if ((undefined8 *)
            lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
            super__Optional_payload_base<wasm::WATParser::Token>._64_8_ != &stack0xffffffffffffff90)
        {
          operator_delete((void *)lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._64_8_,
                          (ulong)(local_70 + 1));
        }
        if (local_28._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_28._M_head_impl + 8))();
        }
        if (gtest_ar_._0_8_ != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&gtest_ar_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       gtest_ar_._0_8_);
        }
      }
      else {
        lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
        super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
        lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
        super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
        local_70 = (undefined1 *)0x0;
        local_68 = 2;
        local_48 = '\x03';
        testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                  (local_40,"*lexer","expected",(Token *)&lexer.index,
                   (Token *)&lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                             _M_payload.
                             super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                             super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
        if (local_40[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_28);
          if (gtest_ar_._0_8_ == 0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)gtest_ar_._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                     ,0x11c,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
          if (local_28._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_28._M_head_impl + 8))();
          }
        }
        if (gtest_ar_._0_8_ != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&gtest_ar_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       gtest_ar_._0_8_);
        }
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             *)&stack0xffffffffffffff90);
      }
      if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
          super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ._M_index == '\x01') {
        lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
        super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ._M_index = '\0';
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             *)((long)&lexer.curr.
                                       super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                       _M_payload.
                                       super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                       .super__Optional_payload_base<wasm::WATParser::Token>.
                                       _M_payload + 8));
      }
      if (!bVar1) {
        buffer_02._M_str = "0x1";
        buffer_02._M_len = 3;
        wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_02);
        bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
        local_40[0] = (internal)!bVar1;
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
        if (bVar1) {
          testing::Message::Message((Message *)&local_28);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)
                     &lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                      _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                      .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,local_40,
                     (AssertionResult *)"lexer.empty()","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                     ,0x120,(char *)lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._64_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
          if ((undefined8 *)
              lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
              super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
              &stack0xffffffffffffff90) {
            operator_delete((void *)lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._64_8_,
                            (ulong)(local_70 + 1));
          }
          if (local_28._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_28._M_head_impl + 8))();
          }
          if (gtest_ar_._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar_._0_8_);
          }
        }
        else {
          lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
          super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
          lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
          super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
          local_70 = (undefined1 *)0x1;
          local_68 = 0;
          local_48 = '\x03';
          testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                    (local_40,"*lexer","expected",(Token *)&lexer.index,
                     (Token *)&lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>
                               ._M_payload.
                               super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                               super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
          if (local_40[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_28);
            if (gtest_ar_._0_8_ == 0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)gtest_ar_._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                       ,0x122,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
            if (local_28._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_28._M_head_impl + 8))();
            }
          }
          if (gtest_ar_._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar_._0_8_);
          }
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               *)&stack0xffffffffffffff90);
        }
        if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
            super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            ._M_index == '\x01') {
          lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
          super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ._M_index = '\0';
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               *)((long)&lexer.curr.
                                         super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                         _M_payload.
                                         super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                         .super__Optional_payload_base<wasm::WATParser::Token>.
                                         _M_payload + 8));
        }
        if (!bVar1) {
          buffer_03._M_str = "+0x1";
          buffer_03._M_len = 4;
          wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_03);
          bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
          local_40[0] = (internal)!bVar1;
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
          if (bVar1) {
            testing::Message::Message((Message *)&local_28);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)
                       &lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                        _M_payload.
                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                        super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,local_40,
                       (AssertionResult *)"lexer.empty()","true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                       ,0x126,(char *)lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
            if ((undefined8 *)
                lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                &stack0xffffffffffffff90) {
              operator_delete((void *)lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_,
                              (ulong)(local_70 + 1));
            }
            if (local_28._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_28._M_head_impl + 8))();
            }
            if (gtest_ar_._0_8_ != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&gtest_ar_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           gtest_ar_._0_8_);
            }
          }
          else {
            lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
            super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
            lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
            super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
            local_70 = (undefined1 *)0x1;
            local_68 = 1;
            local_48 = '\x03';
            testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                      (local_40,"*lexer","expected",(Token *)&lexer.index,
                       (Token *)&lexer.curr.
                                 super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                 _M_payload.
                                 super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                 .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
            if (local_40[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_28);
              if (gtest_ar_._0_8_ == 0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = *(char **)gtest_ar_._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                         ,0x128,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
              if (local_28._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_28._M_head_impl + 8))();
              }
            }
            if (gtest_ar_._0_8_ != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&gtest_ar_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           gtest_ar_._0_8_);
            }
            std::__detail::__variant::
            _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 *)&stack0xffffffffffffff90);
          }
          if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
              super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              ._M_index == '\x01') {
            lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
            super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            ._M_index = '\0';
            std::__detail::__variant::
            _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 *)((long)&lexer.curr.
                                           super__Optional_base<wasm::WATParser::Token,_false,_false>
                                           ._M_payload.
                                           super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                           .super__Optional_payload_base<wasm::WATParser::Token>.
                                           _M_payload + 8));
          }
          if (!bVar1) {
            buffer_04._M_str = "-0x1";
            buffer_04._M_len = 4;
            wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_04);
            bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
            local_40[0] = (internal)!bVar1;
            gtest_ar_.success_ = false;
            gtest_ar_._1_7_ = 0;
            if (bVar1) {
              testing::Message::Message((Message *)&local_28);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)
                         &lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                          _M_payload.
                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                          super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,local_40,
                         (AssertionResult *)"lexer.empty()","true","false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                         ,300,(char *)lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
              if ((undefined8 *)
                  lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                  super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                  &stack0xffffffffffffff90) {
                operator_delete((void *)lexer.curr.
                                        super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                        _M_payload.
                                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                        .super__Optional_payload_base<wasm::WATParser::Token>._64_8_
                                ,(ulong)(local_70 + 1));
              }
              if (local_28._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_28._M_head_impl + 8))();
              }
              if (gtest_ar_._0_8_ != 0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&gtest_ar_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             gtest_ar_._0_8_);
              }
            }
            else {
              lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
              super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
              lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
              super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
              local_70 = (undefined1 *)0xffffffffffffffff;
              local_68 = 2;
              local_48 = '\x03';
              testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                        (local_40,"*lexer","expected",(Token *)&lexer.index,
                         (Token *)&lexer.curr.
                                   super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                   _M_payload.
                                   super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                   .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged)
              ;
              if (local_40[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_28);
                if (gtest_ar_._0_8_ == 0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = *(char **)gtest_ar_._0_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                           ,0x12e,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
                if (local_28._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                }
              }
              if (gtest_ar_._0_8_ != 0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&gtest_ar_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             gtest_ar_._0_8_);
              }
              std::__detail::__variant::
              _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   *)&stack0xffffffffffffff90);
            }
            if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                ._M_index == '\x01') {
              lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
              super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              ._M_index = '\0';
              std::__detail::__variant::
              _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   *)((long)&lexer.curr.
                                             super__Optional_base<wasm::WATParser::Token,_false,_false>
                                             ._M_payload.
                                             super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                             .super__Optional_payload_base<wasm::WATParser::Token>.
                                             _M_payload + 8));
            }
            if (!bVar1) {
              buffer_05._M_str = "0x0010";
              buffer_05._M_len = 6;
              wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_05);
              bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
              local_40[0] = (internal)!bVar1;
              gtest_ar_.success_ = false;
              gtest_ar_._1_7_ = 0;
              if (bVar1) {
                testing::Message::Message((Message *)&local_28);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)
                           &lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                            super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,local_40
                           ,(AssertionResult *)"lexer.empty()","true","false",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                           ,0x132,(char *)lexer.curr.
                                          super__Optional_base<wasm::WATParser::Token,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                          .super__Optional_payload_base<wasm::WATParser::Token>.
                                          _64_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
                if ((undefined8 *)
                    lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload
                    .super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                    super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                    &stack0xffffffffffffff90) {
                  operator_delete((void *)lexer.curr.
                                          super__Optional_base<wasm::WATParser::Token,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                          .super__Optional_payload_base<wasm::WATParser::Token>.
                                          _64_8_,(ulong)(local_70 + 1));
                }
                if (local_28._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                }
                if (gtest_ar_._0_8_ != 0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&gtest_ar_,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               gtest_ar_._0_8_);
                }
              }
              else {
                lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
                lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
                local_70 = (undefined1 *)0x10;
                local_68 = 0;
                local_48 = '\x03';
                testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                          (local_40,"*lexer","expected",(Token *)&lexer.index,
                           (Token *)&lexer.curr.
                                     super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                     _M_payload.
                                     super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                     .super__Optional_payload_base<wasm::WATParser::Token>.
                                     _M_engaged);
                if (local_40[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_28);
                  if (gtest_ar_._0_8_ == 0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = *(char **)gtest_ar_._0_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                             ,0x134,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_);
                  if (local_28._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                  }
                }
                if (gtest_ar_._0_8_ != 0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&gtest_ar_,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               gtest_ar_._0_8_);
                }
                std::__detail::__variant::
                _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     *)&stack0xffffffffffffff90);
              }
              if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                  super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  ._M_index == '\x01') {
                lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                ._M_index = '\0';
                std::__detail::__variant::
                _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     *)((long)&lexer.curr.
                                               super__Optional_base<wasm::WATParser::Token,_false,_false>
                                               ._M_payload.
                                               super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                               .super__Optional_payload_base<wasm::WATParser::Token>
                                               ._M_payload + 8));
              }
              if (!bVar1) {
                buffer_06._M_str = "+0x0010";
                buffer_06._M_len = 7;
                wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_06);
                bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                local_40[0] = (internal)!bVar1;
                gtest_ar_.success_ = false;
                gtest_ar_._1_7_ = 0;
                if (bVar1) {
                  testing::Message::Message((Message *)&local_28);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)
                             &lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                              _M_payload.
                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                              super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                             local_40,(AssertionResult *)"lexer.empty()","true","false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                             ,0x138,(char *)lexer.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _64_8_);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_);
                  if ((undefined8 *)
                      lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                      _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                      &stack0xffffffffffffff90) {
                    operator_delete((void *)lexer.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _64_8_,(ulong)(local_70 + 1));
                  }
                  if (local_28._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                  }
                  if (gtest_ar_._0_8_ != 0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&gtest_ar_,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)gtest_ar_._0_8_);
                  }
                }
                else {
                  lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                  super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
                  lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                  super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
                  local_70 = (undefined1 *)0x10;
                  local_68 = 1;
                  local_48 = '\x03';
                  testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                            (local_40,"*lexer","expected",(Token *)&lexer.index,
                             (Token *)&lexer.curr.
                                       super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                       _M_payload.
                                       super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                       .super__Optional_payload_base<wasm::WATParser::Token>.
                                       _M_engaged);
                  if (local_40[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_28);
                    if (gtest_ar_._0_8_ == 0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = *(char **)gtest_ar_._0_8_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                               ,0x13a,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_.message_);
                    if (local_28._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_28._M_head_impl + 8))();
                    }
                  }
                  if (gtest_ar_._0_8_ != 0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&gtest_ar_,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)gtest_ar_._0_8_);
                  }
                  std::__detail::__variant::
                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       *)&stack0xffffffffffffff90);
                }
                if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload
                    .super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                    super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    ._M_index == '\x01') {
                  lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                  super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  ._M_index = '\0';
                  std::__detail::__variant::
                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       *)((long)&lexer.curr.
                                                 super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                 ._M_payload.
                                                 super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                 .
                                                 super__Optional_payload_base<wasm::WATParser::Token>
                                                 ._M_payload + 8));
                }
                if (!bVar1) {
                  buffer_07._M_str = "-0x0010";
                  buffer_07._M_len = 7;
                  wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_07);
                  bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                  local_40[0] = (internal)!bVar1;
                  gtest_ar_.success_ = false;
                  gtest_ar_._1_7_ = 0;
                  if (bVar1) {
                    testing::Message::Message((Message *)&local_28);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)
                               &lexer.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                               local_40,(AssertionResult *)"lexer.empty()","true","false",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                               ,0x13e,(char *)lexer.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _64_8_);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_.message_);
                    if ((undefined8 *)
                        lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                        _M_payload.
                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                        super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                        &stack0xffffffffffffff90) {
                      operator_delete((void *)lexer.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _64_8_,(ulong)(local_70 + 1));
                    }
                    if (local_28._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_28._M_head_impl + 8))();
                    }
                    if (gtest_ar_._0_8_ != 0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&gtest_ar_,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)gtest_ar_._0_8_);
                    }
                  }
                  else {
                    lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload
                    .super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                    super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
                    lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload
                    .super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                    super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
                    local_70 = (undefined1 *)0xfffffffffffffff0;
                    local_68 = 2;
                    local_48 = '\x03';
                    testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                              (local_40,"*lexer","expected",(Token *)&lexer.index,
                               (Token *)&lexer.curr.
                                         super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                         _M_payload.
                                         super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                         .super__Optional_payload_base<wasm::WATParser::Token>.
                                         _M_engaged);
                    if (local_40[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&local_28);
                      if (gtest_ar_._0_8_ == 0) {
                        pcVar2 = "";
                      }
                      else {
                        pcVar2 = *(char **)gtest_ar_._0_8_;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                 ,0x140,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_.message_);
                      if (local_28._M_head_impl !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        (**(code **)(*(long *)local_28._M_head_impl + 8))();
                      }
                    }
                    if (gtest_ar_._0_8_ != 0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&gtest_ar_,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)gtest_ar_._0_8_);
                    }
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         *)&stack0xffffffffffffff90);
                  }
                  if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                      _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                      .super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data
                      .
                      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      ._M_index == '\x01') {
                    lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload
                    .super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                    super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    ._M_index = '\0';
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         *)((long)&lexer.curr.
                                                                                                      
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                  }
                  if (!bVar1) {
                    buffer_08._M_str = "0xabcdef";
                    buffer_08._M_len = 8;
                    wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_08);
                    bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                    local_40[0] = (internal)!bVar1;
                    gtest_ar_.success_ = false;
                    gtest_ar_._1_7_ = 0;
                    if (bVar1) {
                      testing::Message::Message((Message *)&local_28);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)
                                 &lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                                 local_40,(AssertionResult *)"lexer.empty()","true","false",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                 ,0x144,(char *)lexer.curr.
                                                super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                ._M_payload.
                                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                .
                                                super__Optional_payload_base<wasm::WATParser::Token>
                                                ._64_8_);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_.message_);
                      if ((undefined8 *)
                          lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                          _M_payload.
                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                          super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                          &stack0xffffffffffffff90) {
                        operator_delete((void *)lexer.curr.
                                                super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                ._M_payload.
                                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                .
                                                super__Optional_payload_base<wasm::WATParser::Token>
                                                ._64_8_,(ulong)(local_70 + 1));
                      }
                      if (local_28._M_head_impl !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        (**(code **)(*(long *)local_28._M_head_impl + 8))();
                      }
                      if (gtest_ar_._0_8_ != 0) {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&gtest_ar_,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)gtest_ar_._0_8_);
                      }
                    }
                    else {
                      lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                      _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                      .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
                      lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                      _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                      .super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
                      local_70 = (undefined1 *)0xabcdef;
                      local_68 = 0;
                      local_48 = '\x03';
                      testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                                (local_40,"*lexer","expected",(Token *)&lexer.index,
                                 (Token *)&lexer.curr.
                                           super__Optional_base<wasm::WATParser::Token,_false,_false>
                                           ._M_payload.
                                           super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                           .super__Optional_payload_base<wasm::WATParser::Token>.
                                           _M_engaged);
                      if (local_40[0] == (internal)0x0) {
                        testing::Message::Message((Message *)&local_28);
                        if (gtest_ar_._0_8_ == 0) {
                          pcVar2 = "";
                        }
                        else {
                          pcVar2 = *(char **)gtest_ar_._0_8_;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                   ,0x146,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_.message_);
                        if (local_28._M_head_impl !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) {
                          (**(code **)(*(long *)local_28._M_head_impl + 8))();
                        }
                      }
                      if (gtest_ar_._0_8_ != 0) {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&gtest_ar_,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)gtest_ar_._0_8_);
                      }
                      std::__detail::__variant::
                      _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                           *)&stack0xffffffffffffff90);
                    }
                    if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                        _M_payload.
                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                        super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.
                        data.
                        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        ._M_index == '\x01') {
                      lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                      _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                      .super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data
                      .
                      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      ._M_index = '\0';
                      std::__detail::__variant::
                      _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                           *)((long)&lexer.curr.
                                                                                                          
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                    }
                    if (!bVar1) {
                      buffer_09._M_str = "+0xABCDEF";
                      buffer_09._M_len = 9;
                      wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_09);
                      bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                      local_40[0] = (internal)!bVar1;
                      gtest_ar_.success_ = false;
                      gtest_ar_._1_7_ = 0;
                      if (bVar1) {
                        testing::Message::Message((Message *)&local_28);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)
                                   &lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged
                                   ,local_40,(AssertionResult *)"lexer.empty()","true","false",in_R9
                                  );
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                   ,0x14a,(char *)lexer.curr.
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_.message_);
                        if ((undefined8 *)
                            lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                            super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                            &stack0xffffffffffffff90) {
                          operator_delete((void *)lexer.curr.
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,(ulong)(local_70 + 1));
                        }
                        if (local_28._M_head_impl !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) {
                          (**(code **)(*(long *)local_28._M_head_impl + 8))();
                        }
                        if (gtest_ar_._0_8_ != 0) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&gtest_ar_,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)gtest_ar_._0_8_);
                        }
                      }
                      else {
                        lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                        _M_payload.
                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                        super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
                        lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                        _M_payload.
                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                        super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
                        local_70 = (undefined1 *)0xabcdef;
                        local_68 = 1;
                        local_48 = '\x03';
                        testing::internal::
                        CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                                  (local_40,"*lexer","expected",(Token *)&lexer.index,
                                   (Token *)&lexer.curr.
                                             super__Optional_base<wasm::WATParser::Token,_false,_false>
                                             ._M_payload.
                                             super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                             .super__Optional_payload_base<wasm::WATParser::Token>.
                                             _M_engaged);
                        if (local_40[0] == (internal)0x0) {
                          testing::Message::Message((Message *)&local_28);
                          if (gtest_ar_._0_8_ == 0) {
                            pcVar2 = "";
                          }
                          else {
                            pcVar2 = *(char **)gtest_ar_._0_8_;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                     ,0x14c,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_.message_);
                          if (local_28._M_head_impl !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0) {
                            (**(code **)(*(long *)local_28._M_head_impl + 8))();
                          }
                        }
                        if (gtest_ar_._0_8_ != 0) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&gtest_ar_,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)gtest_ar_._0_8_);
                        }
                        std::__detail::__variant::
                        _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                             *)&stack0xffffffffffffff90);
                      }
                      if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                          _M_payload.
                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                          super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.
                          data.
                          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          ._M_index == '\x01') {
                        lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                        _M_payload.
                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                        super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.
                        data.
                        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        ._M_index = '\0';
                        std::__detail::__variant::
                        _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                             *)((long)&lexer.curr.
                                                                                                              
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                      }
                      if (!bVar1) {
                        buffer_10._M_str = "-0xAbCdEf";
                        buffer_10._M_len = 9;
                        wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_10);
                        bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                        local_40[0] = (internal)!bVar1;
                        gtest_ar_.success_ = false;
                        gtest_ar_._1_7_ = 0;
                        if (bVar1) {
                          testing::Message::Message((Message *)&local_28);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)
                                     &lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>.
                                      _M_engaged,local_40,(AssertionResult *)"lexer.empty()","true",
                                     "false",in_R9);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                     ,0x150,(char *)lexer.curr.
                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_.message_);
                          if ((undefined8 *)
                              lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                              _M_payload.
                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                              super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                              &stack0xffffffffffffff90) {
                            operator_delete((void *)lexer.curr.
                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,(ulong)(local_70 + 1));
                          }
                          if (local_28._M_head_impl !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0) {
                            (**(code **)(*(long *)local_28._M_head_impl + 8))();
                          }
                          if (gtest_ar_._0_8_ != 0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&gtest_ar_,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)gtest_ar_._0_8_);
                          }
                        }
                        else {
                          lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                          _M_payload.
                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                          super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
                          lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                          _M_payload.
                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                          super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
                          local_70 = (undefined1 *)0xffffffffff543211;
                          local_68 = 2;
                          local_48 = '\x03';
                          testing::internal::
                          CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                                    (local_40,"*lexer","expected",(Token *)&lexer.index,
                                     (Token *)&lexer.curr.
                                               super__Optional_base<wasm::WATParser::Token,_false,_false>
                                               ._M_payload.
                                               super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                               .super__Optional_payload_base<wasm::WATParser::Token>
                                               ._M_engaged);
                          if (local_40[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_28);
                            if (gtest_ar_._0_8_ == 0) {
                              pcVar2 = "";
                            }
                            else {
                              pcVar2 = *(char **)gtest_ar_._0_8_;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                       ,0x152,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_.message_);
                            if (local_28._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_28._M_head_impl + 8))();
                            }
                          }
                          if (gtest_ar_._0_8_ != 0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&gtest_ar_,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)gtest_ar_._0_8_);
                          }
                          std::__detail::__variant::
                          _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                               *)&stack0xffffffffffffff90);
                        }
                        if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                            super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value
                            .data.
                            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            ._M_index == '\x01') {
                          lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                          _M_payload.
                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                          super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.
                          data.
                          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          ._M_index = '\0';
                          std::__detail::__variant::
                          _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                               *)((long)&lexer.curr.
                                                                                                                  
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                        }
                        if (!bVar1) {
                          buffer_11._M_str = "0x12_34";
                          buffer_11._M_len = 7;
                          wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_11);
                          bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                          local_40[0] = (internal)!bVar1;
                          gtest_ar_.success_ = false;
                          gtest_ar_._1_7_ = 0;
                          if (bVar1) {
                            testing::Message::Message((Message *)&local_28);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)
                                       &lexer.curr.
                                        super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                        _M_payload.
                                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                        .super__Optional_payload_base<wasm::WATParser::Token>.
                                        _M_engaged,local_40,(AssertionResult *)"lexer.empty()",
                                       "true","false",in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                       ,0x156,(char *)lexer.curr.
                                                                                                            
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_.message_);
                            if ((undefined8 *)
                                lexer.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                                &stack0xffffffffffffff90) {
                              operator_delete((void *)lexer.curr.
                                                                                                            
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,(ulong)(local_70 + 1));
                            }
                            if (local_28._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_28._M_head_impl + 8))();
                            }
                            if (gtest_ar_._0_8_ != 0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&gtest_ar_,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)gtest_ar_._0_8_);
                            }
                          }
                          else {
                            lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                            super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
                            lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                            super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
                            local_70 = &DAT_00001234;
                            local_68 = 0;
                            local_48 = '\x03';
                            testing::internal::
                            CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                                      (local_40,"*lexer","expected",(Token *)&lexer.index,
                                       (Token *)&lexer.curr.
                                                 super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                 ._M_payload.
                                                 super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                 .
                                                 super__Optional_payload_base<wasm::WATParser::Token>
                                                 ._M_engaged);
                            if (local_40[0] == (internal)0x0) {
                              testing::Message::Message((Message *)&local_28);
                              if (gtest_ar_._0_8_ == 0) {
                                pcVar2 = "";
                              }
                              else {
                                pcVar2 = *(char **)gtest_ar_._0_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                         ,0x158,pcVar2);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_.message_);
                              if (local_28._M_head_impl !=
                                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                (**(code **)(*(long *)local_28._M_head_impl + 8))();
                              }
                            }
                            if (gtest_ar_._0_8_ != 0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&gtest_ar_,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)gtest_ar_._0_8_);
                            }
                            std::__detail::__variant::
                            _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                 *)&stack0xffffffffffffff90);
                          }
                          if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                              _M_payload.
                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                              super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                              _M_value.data.
                              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              ._M_index == '\x01') {
                            lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                            super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value
                            .data.
                            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            ._M_index = '\0';
                            std::__detail::__variant::
                            _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                 *)((long)&lexer.curr.
                                                                                                                      
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                          }
                          if (!bVar1) {
                            buffer_12._M_str = "0x1_2_3_4";
                            buffer_12._M_len = 9;
                            wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_12);
                            bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                            local_40[0] = (internal)!bVar1;
                            gtest_ar_.success_ = false;
                            gtest_ar_._1_7_ = 0;
                            if (bVar1) {
                              testing::Message::Message((Message *)&local_28);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)
                                         &lexer.curr.
                                          super__Optional_base<wasm::WATParser::Token,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                          .super__Optional_payload_base<wasm::WATParser::Token>.
                                          _M_engaged,local_40,(AssertionResult *)"lexer.empty()",
                                         "true","false",in_R9);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                         ,0x15c,(char *)lexer.curr.
                                                                                                                
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_.message_);
                              if ((undefined8 *)
                                  lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                                  &stack0xffffffffffffff90) {
                                operator_delete((void *)lexer.curr.
                                                                                                                
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,(ulong)(local_70 + 1));
                              }
                              if (local_28._M_head_impl !=
                                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                (**(code **)(*(long *)local_28._M_head_impl + 8))();
                              }
                              if (gtest_ar_._0_8_ != 0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&gtest_ar_,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)gtest_ar_._0_8_);
                              }
                            }
                            else {
                              lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                              _M_payload.
                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                              super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true
                              ;
                              lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                              _M_payload.
                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                              super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
                              local_70 = &DAT_00001234;
                              local_68 = 0;
                              local_48 = '\x03';
                              testing::internal::
                              CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                                        (local_40,"*lexer","expected",(Token *)&lexer.index,
                                         (Token *)&lexer.curr.
                                                                                                      
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_engaged);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                if (gtest_ar_._0_8_ == 0) {
                                  pcVar2 = "";
                                }
                                else {
                                  pcVar2 = *(char **)gtest_ar_._0_8_;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x15e,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28)
                                ;
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_);
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (gtest_ar_._0_8_ != 0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&gtest_ar_,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)gtest_ar_._0_8_);
                              }
                              std::__detail::__variant::
                              _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)&stack0xffffffffffffff90);
                            }
                            if (lexer.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                _M_value.data.
                                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                ._M_index == '\x01') {
                              lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                              _M_payload.
                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                              super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                              _M_value.data.
                              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              ._M_index = '\0';
                              std::__detail::__variant::
                              _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                            }
                            if (!bVar1) {
                              buffer_13._M_str = "_0x1234";
                              buffer_13._M_len = 7;
                              wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_13);
                              local_40[0] = (internal)
                                            wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              if (!(bool)local_40[0]) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)
                                           &lexer.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged,local_40,(AssertionResult *)"lexer.empty()",
                                           "false","true",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x162,(char *)lexer.curr.
                                                                                                                    
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28)
                                ;
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_);
                                if ((undefined8 *)
                                    lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                                    &stack0xffffffffffffff90) {
                                  operator_delete((void *)lexer.curr.
                                                                                                                    
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,(ulong)(local_70 + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (gtest_ar_._0_8_ != 0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&gtest_ar_,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)gtest_ar_._0_8_);
                              }
                              if (lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index == '\x01') {
                                lexer.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                _M_value.data.
                                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                ._M_index = '\0';
                                std::__detail::__variant::
                                _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                              }
                              buffer_14._M_str = "0x_1234";
                              buffer_14._M_len = 7;
                              wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_14);
                              local_40[0] = (internal)
                                            wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              if (!(bool)local_40[0]) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)
                                           &lexer.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged,local_40,(AssertionResult *)"lexer.empty()",
                                           "false","true",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x166,(char *)lexer.curr.
                                                                                                                    
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28)
                                ;
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_);
                                if ((undefined8 *)
                                    lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                                    &stack0xffffffffffffff90) {
                                  operator_delete((void *)lexer.curr.
                                                                                                                    
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,(ulong)(local_70 + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (gtest_ar_._0_8_ != 0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&gtest_ar_,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)gtest_ar_._0_8_);
                              }
                              if (lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index == '\x01') {
                                lexer.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                _M_value.data.
                                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                ._M_index = '\0';
                                std::__detail::__variant::
                                _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                              }
                              buffer_15._M_str = "0x1234_";
                              buffer_15._M_len = 7;
                              wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_15);
                              local_40[0] = (internal)
                                            wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              if (!(bool)local_40[0]) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)
                                           &lexer.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged,local_40,(AssertionResult *)"lexer.empty()",
                                           "false","true",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x16a,(char *)lexer.curr.
                                                                                                                    
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28)
                                ;
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_);
                                if ((undefined8 *)
                                    lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                                    &stack0xffffffffffffff90) {
                                  operator_delete((void *)lexer.curr.
                                                                                                                    
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,(ulong)(local_70 + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (gtest_ar_._0_8_ != 0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&gtest_ar_,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)gtest_ar_._0_8_);
                              }
                              if (lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index == '\x01') {
                                lexer.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                _M_value.data.
                                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                ._M_index = '\0';
                                std::__detail::__variant::
                                _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                              }
                              buffer_16._M_str = "0x12__34";
                              buffer_16._M_len = 8;
                              wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_16);
                              local_40[0] = (internal)
                                            wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              if (!(bool)local_40[0]) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)
                                           &lexer.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged,local_40,(AssertionResult *)"lexer.empty()",
                                           "false","true",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x16e,(char *)lexer.curr.
                                                                                                                    
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28)
                                ;
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_);
                                if ((undefined8 *)
                                    lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                                    &stack0xffffffffffffff90) {
                                  operator_delete((void *)lexer.curr.
                                                                                                                    
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,(ulong)(local_70 + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (gtest_ar_._0_8_ != 0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&gtest_ar_,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)gtest_ar_._0_8_);
                              }
                              if (lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index == '\x01') {
                                lexer.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                _M_value.data.
                                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                ._M_index = '\0';
                                std::__detail::__variant::
                                _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                              }
                              buffer_17._M_str = "0xg";
                              buffer_17._M_len = 3;
                              wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_17);
                              local_40[0] = (internal)
                                            wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              if (!(bool)local_40[0]) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)
                                           &lexer.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged,local_40,(AssertionResult *)"lexer.empty()",
                                           "false","true",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x172,(char *)lexer.curr.
                                                                                                                    
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28)
                                ;
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_);
                                if ((undefined8 *)
                                    lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                                    &stack0xffffffffffffff90) {
                                  operator_delete((void *)lexer.curr.
                                                                                                                    
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,(ulong)(local_70 + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (gtest_ar_._0_8_ != 0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&gtest_ar_,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)gtest_ar_._0_8_);
                              }
                              if (lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index == '\x01') {
                                lexer.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                _M_value.data.
                                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                ._M_index = '\0';
                                std::__detail::__variant::
                                _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                              }
                              buffer_18._M_str = "0x120x34";
                              buffer_18._M_len = 8;
                              wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_18);
                              local_40[0] = (internal)
                                            wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              if (!(bool)local_40[0]) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)
                                           &lexer.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged,local_40,(AssertionResult *)"lexer.empty()",
                                           "false","true",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x176,(char *)lexer.curr.
                                                                                                                    
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28)
                                ;
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_);
                                if ((undefined8 *)
                                    lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                                    &stack0xffffffffffffff90) {
                                  operator_delete((void *)lexer.curr.
                                                                                                                    
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,(ulong)(local_70 + 1));
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (gtest_ar_._0_8_ != 0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&gtest_ar_,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)gtest_ar_._0_8_);
                              }
                              if (lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index == '\x01') {
                                lexer.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                _M_value.data.
                                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                ._M_index = '\0';
                                std::__detail::__variant::
                                _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(LexerTest, LexHexInt) {
  {
    Lexer lexer("0x0"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"0x0"sv, IntTok{0, NoSign}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("+0x0"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"+0x0"sv, IntTok{0, Pos}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("-0x0"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"-0x0"sv, IntTok{0, Neg}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("0x1"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"0x1"sv, IntTok{1, NoSign}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("+0x1"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"+0x1"sv, IntTok{1, Pos}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("-0x1"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"-0x1"sv, IntTok{-1ull, Neg}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("0x0010"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"0x0010"sv, IntTok{16, NoSign}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("+0x0010"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"+0x0010"sv, IntTok{16, Pos}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("-0x0010"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"-0x0010"sv, IntTok{-16ull, Neg}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("0xabcdef"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"0xabcdef"sv, IntTok{0xabcdef, NoSign}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("+0xABCDEF"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"+0xABCDEF"sv, IntTok{0xabcdef, Pos}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("-0xAbCdEf"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"-0xAbCdEf"sv, IntTok{-0xabcdefull, Neg}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("0x12_34"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"0x12_34"sv, IntTok{0x1234, NoSign}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("0x1_2_3_4"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"0x1_2_3_4"sv, IntTok{0x1234, NoSign}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("_0x1234"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("0x_1234"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("0x1234_"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("0x12__34"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("0xg"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("0x120x34"sv);
    EXPECT_TRUE(lexer.empty());
  }
}